

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::fill_n<fmt::v9::appender,int,char>(appender out,int count,char *value)

{
  back_insert_iterator<fmt::v9::detail::buffer<char>_> this;
  value_type *in_RDX;
  int in_ESI;
  buffer<char> *in_RDI;
  int i;
  value_type *__value;
  int local_24;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_10 [2];
  
  local_10[0].container = in_RDI;
  for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
    __value = in_RDX;
    this.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*
              ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)&stack0xffffffffffffffd0);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
              ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)this.container,__value);
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_10[0].container;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}